

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O2

vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
* treecut_ratio(vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                *__return_storage_ptr__,SphereTree *hierarchy,vec3f cluster_center,
               float cluster_radius,float angle_limit,float detailed_angle_limit)

{
  float fVar1;
  pointer pSVar2;
  vec3f cluster_center_00;
  data_t dVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  SH<15> *__return_storage_ptr___00;
  pointer pSVar7;
  SH<15> *__return_storage_ptr___01;
  uint uVar8;
  float fVar9;
  float fVar10;
  vec3f vVar11;
  vec3f cluster_center_01;
  vec3f cluster_center_02;
  initializer_list<Sphere> __l;
  initializer_list<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_> __l_00;
  allocator_type local_819;
  vec3f local_818;
  undefined1 local_808 [28];
  float local_7ec;
  float local_7e8;
  float local_7e4;
  vector<float,_std::allocator<float>_> w;
  _Vector_base<Sphere,_std::allocator<Sphere>_> local_7c8;
  _Vector_base<Sphere,_std::allocator<Sphere>_> local_7b0;
  vector<Sphere,_std::allocator<Sphere>_> detailed;
  vector<Sphere,_std::allocator<Sphere>_> bounding;
  pair<Sphere,_std::vector<float,_std::allocator<float>_>_> local_768;
  SH<15> fd;
  SH<15> fb;
  
  local_818.z = cluster_center.z;
  local_818._0_8_ = cluster_center._0_8_;
  local_808._0_4_ = cluster_radius;
  if ((hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_7e8 = (hierarchy->bound).radius;
    local_7e4 = angle_limit;
    local_7ec = sinf(angle_limit);
    vVar11 = operator-((vec3f *)hierarchy,&local_818);
    if ((SQRT(vVar11.z * vVar11.z + vVar11.x * vVar11.x + vVar11.y * vVar11.y) -
        (float)local_808._0_4_) * local_7ec <= local_7e8) {
      (__return_storage_ptr__->
      super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pSVar2 = (hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (pSVar7 = (hierarchy->child).super__Vector_base<SphereTree,_std::allocator<SphereTree>_>.
                    _M_impl.super__Vector_impl_data._M_start; pSVar7 != pSVar2; pSVar7 = pSVar7 + 1)
      {
        SphereTree::SphereTree((SphereTree *)&fb,pSVar7);
        vVar11.z = local_818.z;
        vVar11.x = local_818.x;
        vVar11.y = local_818.y;
        treecut_ratio((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                       *)&fd,(SphereTree *)&fb,vVar11,(float)local_808._0_4_,local_7e4,
                      detailed_angle_limit);
        std::
        vector<std::pair<Sphere,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<Sphere,std::vector<float,std::allocator<float>>>>>
        ::
        insert<__gnu_cxx::__normal_iterator<std::pair<Sphere,std::vector<float,std::allocator<float>>>*,std::vector<std::pair<Sphere,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<Sphere,std::vector<float,std::allocator<float>>>>>>,void>
                  ((vector<std::pair<Sphere,std::vector<float,std::allocator<float>>>,std::allocator<std::pair<Sphere,std::vector<float,std::allocator<float>>>>>
                    *)__return_storage_ptr__,
                   (__return_storage_ptr__->
                   super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_*,_std::vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>_>
                    )fd.a._0_8_,
                   (__normal_iterator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_*,_std::vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>_>
                    )fd.a._8_8_);
        std::
        vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
        ::~vector((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                   *)&fd);
        std::vector<SphereTree,_std::allocator<SphereTree>_>::~vector
                  ((vector<SphereTree,_std::allocator<SphereTree>_> *)(fb.a + 4));
      }
      return __return_storage_ptr__;
    }
  }
  fb.a[0] = (hierarchy->bound).center.x;
  fb.a[1] = (hierarchy->bound).center.y;
  fb.a._8_8_ = *(undefined8 *)&(hierarchy->bound).center.z;
  __l._M_len = 1;
  __l._M_array = (iterator)&fb;
  std::vector<Sphere,_std::allocator<Sphere>_>::vector(&bounding,__l,(allocator_type *)&fd);
  cluster_center_00.z = local_818.z;
  cluster_center_00.x = local_818.x;
  cluster_center_00.y = local_818.y;
  treecut(&detailed,hierarchy,cluster_center_00,(float)local_808._0_4_,detailed_angle_limit);
  std::vector<float,_std::allocator<float>_>::vector(&w,0xf,(allocator_type *)&fb);
  dVar3 = local_818.z;
  local_808._0_4_ = local_818.x;
  local_808._4_4_ = local_818.y;
  local_808._8_8_ = 0;
  std::vector<Sphere,_std::allocator<Sphere>_>::vector
            ((vector<Sphere,_std::allocator<Sphere>_> *)&local_7b0,&bounding);
  __return_storage_ptr___01 = &fb;
  cluster_center_01.z = dVar3;
  cluster_center_01.x = (data_t)local_808._0_4_;
  cluster_center_01.y = (data_t)local_808._4_4_;
  log_visibility(__return_storage_ptr___01,cluster_center_01,
                 (vector<Sphere,_std::allocator<Sphere>_> *)&local_7b0);
  std::_Vector_base<Sphere,_std::allocator<Sphere>_>::~_Vector_base(&local_7b0);
  dVar3 = local_818.z;
  local_808._0_4_ = local_818.x;
  local_808._4_4_ = local_818.y;
  local_808._8_8_ = 0;
  std::vector<Sphere,_std::allocator<Sphere>_>::vector
            ((vector<Sphere,_std::allocator<Sphere>_> *)&local_7c8,&detailed);
  __return_storage_ptr___00 = &fd;
  cluster_center_02.z = dVar3;
  cluster_center_02.x = (data_t)local_808._0_4_;
  cluster_center_02.y = (data_t)local_808._4_4_;
  log_visibility(__return_storage_ptr___00,cluster_center_02,
                 (vector<Sphere,_std::allocator<Sphere>_> *)&local_7c8);
  std::_Vector_base<Sphere,_std::allocator<Sphere>_>::~_Vector_base(&local_7c8);
  lVar4 = 4;
  lVar5 = 0;
  while (lVar5 != 0xf) {
    fVar9 = 0.0;
    fVar10 = 0.0;
    for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 4) {
      fVar1 = *(float *)((long)__return_storage_ptr___01->a + lVar6);
      fVar9 = fVar9 + fVar1 * fVar1;
      fVar10 = fVar10 + *(float *)((long)__return_storage_ptr___00->a + lVar6) * fVar1;
    }
    uVar8 = -(uint)NAN(fVar10 / fVar9);
    w.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
    [lVar5] = (float)(uVar8 & 0x3f800000 | ~uVar8 & (uint)(fVar10 / fVar9));
    __return_storage_ptr___01 = (SH<15> *)((long)__return_storage_ptr___01->a + lVar4);
    __return_storage_ptr___00 = (SH<15> *)((long)__return_storage_ptr___00->a + lVar4);
    lVar4 = lVar4 + 8;
    lVar5 = lVar5 + 1;
  }
  local_768.first.center.x = (hierarchy->bound).center.x;
  local_768.first.center.y = (hierarchy->bound).center.y;
  local_768.first._8_8_ = *(undefined8 *)&(hierarchy->bound).center.z;
  std::vector<float,_std::allocator<float>_>::vector(&local_768.second,&w);
  __l_00._M_len = 1;
  __l_00._M_array = &local_768;
  std::
  vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
  ::vector(__return_storage_ptr__,__l_00,&local_819);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&local_768.second.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&w.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<Sphere,_std::allocator<Sphere>_>::~_Vector_base
            (&detailed.super__Vector_base<Sphere,_std::allocator<Sphere>_>);
  std::_Vector_base<Sphere,_std::allocator<Sphere>_>::~_Vector_base
            (&bounding.super__Vector_base<Sphere,_std::allocator<Sphere>_>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<Sphere, std::vector<float>>> treecut_ratio(const SphereTree& hierarchy, vec3f cluster_center, float cluster_radius, float angle_limit, float detailed_angle_limit)
{
	// stop recursing if the blockersphere subtends an angle less than angle_limit
	if (hierarchy.child.empty() || hierarchy.bound.radius < sin(angle_limit) * (norm(hierarchy.bound.center - cluster_center) - cluster_radius))
	{
		std::vector<Sphere> bounding = {hierarchy.bound};
		std::vector<Sphere> detailed = treecut(hierarchy, cluster_center, cluster_radius, detailed_angle_limit);
		std::vector<float> w(shorder);
		SH<shorder> fb = log_visibility(cluster_center, bounding);
		SH<shorder> fd = log_visibility(cluster_center, detailed);
		for (int l=0; l<shorder; ++l) {
			float bd=0, bb=0;
			for (int m=-l; m<=l; ++m) {
				bd += fb.at(l,m) * fd.at(l,m);
				bb += fb.at(l,m) * fb.at(l,m);
			}
			w[l] = bd / bb;
			// replace nan with 1
			if (std::isnan(w[l]))
				w[l] = 1.0f;
		}
		return {{hierarchy.bound, w}};
	}
	std::vector<std::pair<Sphere, std::vector<float>>> res;
	for (auto c: hierarchy.child)
	{
		auto cut = treecut_ratio(c, cluster_center, cluster_radius, angle_limit, detailed_angle_limit);
		res.insert(res.end(), cut.begin(), cut.end());
	}
	return res;
}